

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.cpp
# Opt level: O1

char * zmq_msg_gets(zmq_msg_t *msg_,char *property_)

{
  metadata_t *this;
  char *pcVar1;
  int *piVar2;
  allocator<char> local_39;
  string local_38;
  
  this = zmq::msg_t::metadata((msg_t *)msg_);
  if (this == (metadata_t *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,property_,&local_39);
    pcVar1 = zmq::metadata_t::get(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (pcVar1 == (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

const char *zmq_msg_gets (const zmq_msg_t *msg_, const char *property_)
{
    const zmq::metadata_t *metadata =
      reinterpret_cast<const zmq::msg_t *> (msg_)->metadata ();
    const char *value = NULL;
    if (metadata)
        value = metadata->get (std::string (property_));
    if (value)
        return value;

    errno = EINVAL;
    return NULL;
}